

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  string *source;
  cmake *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  string path;
  string local_250;
  string local_230;
  cmListFileContext lfc;
  cmOutputConverter converter;
  ostringstream msg;
  
  if (this->WarnUnused != true) {
    return;
  }
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
  lfc.Name._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  lfc.Name.field_2._M_local_buf[0] = '\0';
  lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
  lfc.FilePath._M_string_length = 0;
  lfc.FilePath.field_2._M_local_buf[0] = '\0';
  lfc.Line = 0;
  source = &lfc.FilePath;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    std::__cxx11::string::assign((char *)&path);
    std::__cxx11::string::append((char *)&path);
    std::__cxx11::string::_M_assign((string *)source);
    lfc.Line = 0;
  }
  else {
    GetExecutionContext((cmListFileContext *)&msg,this);
    cmListFileContext::operator=(&lfc,(cmListFileContext *)&msg);
    cmListFileContext::~cmListFileContext((cmListFileContext *)&msg);
    std::__cxx11::string::_M_assign((string *)&path);
  }
  cmOutputConverter::cmOutputConverter(&converter,this->StateSnapshot);
  cmOutputConverter::Convert((string *)&msg,&converter,source,HOME,UNCHANGED);
  std::__cxx11::string::operator=((string *)source,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  if (this->CheckSystemVars == false) {
    pcVar2 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)&msg,pcVar2,&local_271);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&path,(string *)&msg);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&msg);
    }
    else {
      pcVar2 = GetHomeOutputDirectory(this);
      std::__cxx11::string::string((string *)&local_250,pcVar2,&local_272);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&path,&local_250);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&msg);
        goto LAB_00339157;
      }
      std::__cxx11::string::string((string *)&local_230,"/CMakeFiles",&local_273);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&path,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&msg);
      if (bVar1) goto LAB_00339157;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar3 = std::operator<<((ostream *)&msg,"unused variable (");
  poVar3 = std::operator<<(poVar3,reason);
  poVar3 = std::operator<<(poVar3,") \'");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3,"\'");
  this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
  std::__cxx11::stringbuf::str();
  cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_250,&lfc);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_00339157:
  cmListFileContext::~cmListFileContext(&lfc);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason,
                                const std::string& name) const
{
  if (this->WarnUnused)
    {
    std::string path;
    cmListFileContext lfc;
    if (!this->CallStack.empty())
      {
      lfc = this->GetExecutionContext();
      path = lfc.FilePath;
      }
    else
      {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
      lfc.FilePath = path;
      lfc.Line = 0;
      }
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeOutputDirectory()) &&
        !cmSystemTools::IsSubDirectory(path,
                                cmake::GetCMakeFilesDirectory())))
      {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                             msg.str(),
                                             lfc);
      }
    }
}